

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void deque_int(void)

{
  initializer_list<int> __l;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250 [32];
  Assert local_230;
  outputter<std::deque<int,_std::allocator<int>_>_> local_220;
  stringstream local_218 [8];
  stringstream ss;
  ostream local_208 [399];
  allocator<int> local_79;
  int local_78 [4];
  iterator local_68;
  size_type local_60;
  undefined1 local_58 [8];
  deque<int,_std::allocator<int>_> s;
  
  local_78[0] = 0;
  local_78[1] = 1;
  local_78[2] = 2;
  local_78[3] = 0x9c;
  local_68 = local_78;
  local_60 = 4;
  std::allocator<int>::allocator(&local_79);
  __l._M_len = local_60;
  __l._M_array = local_68;
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)local_58,__l,&local_79);
  std::allocator<int>::~allocator(&local_79);
  std::__cxx11::stringstream::stringstream(local_218);
  local_220 = UnitTests::stream_any<std::deque<int,std::allocator<int>>>
                        ((deque<int,_std::allocator<int>_> *)local_58);
  UnitTests::stream_any_details::operator<<(local_208,&local_220);
  UnitTests::Assert::Assert
            (&local_230,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x7a);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_230,(char (*) [15])"[0, 1, 2, 156]",local_250);
  std::__cxx11::string::~string((string *)local_250);
  std::__cxx11::stringstream::~stringstream(local_218);
  std::deque<int,_std::allocator<int>_>::~deque((deque<int,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

TEST(deque_int)
{
    auto s  = std::deque<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}